

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageSupport::ImageSupport
          (ImageSupport *this,ResourceDescription *resourceDesc,AccessMode mode,
          VkShaderStageFlagBits stage,DispatchCall dispatchCall)

{
  char *__s;
  allocator<char> local_35 [17];
  DispatchCall local_24;
  VkShaderStageFlagBits local_20;
  DispatchCall dispatchCall_local;
  VkShaderStageFlagBits stage_local;
  AccessMode mode_local;
  ResourceDescription *resourceDesc_local;
  ImageSupport *this_local;
  
  local_24 = dispatchCall;
  local_20 = stage;
  dispatchCall_local = mode;
  _stage_local = resourceDesc;
  resourceDesc_local = (ResourceDescription *)this;
  OperationSupport::OperationSupport(&this->super_OperationSupport);
  (this->super_OperationSupport)._vptr_OperationSupport = (_func_int **)&PTR__ImageSupport_016b35b0;
  ResourceDescription::ResourceDescription(&this->m_resourceDesc,_stage_local);
  this->m_mode = dispatchCall_local;
  this->m_stage = local_20;
  __s = "write_image_";
  if (this->m_mode == ACCESS_MODE_READ) {
    __s = "read_image_";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_shaderPrefix,__s,local_35);
  std::allocator<char>::~allocator(local_35);
  this->m_dispatchCall = local_24;
  assertValidShaderStage(this->m_stage);
  return;
}

Assistant:

ImageSupport (const ResourceDescription&	resourceDesc,
				  const AccessMode				mode,
				  const VkShaderStageFlagBits	stage,
				  const DispatchCall			dispatchCall = DISPATCH_CALL_DISPATCH)
		: m_resourceDesc	(resourceDesc)
		, m_mode			(mode)
		, m_stage			(stage)
		, m_shaderPrefix	(m_mode == ACCESS_MODE_READ ? "read_image_" : "write_image_")
		, m_dispatchCall	(dispatchCall)
	{
		DE_ASSERT(m_resourceDesc.type == RESOURCE_TYPE_IMAGE);
		DE_ASSERT(m_mode == ACCESS_MODE_READ || m_mode == ACCESS_MODE_WRITE);
		DE_ASSERT(m_dispatchCall == DISPATCH_CALL_DISPATCH || m_dispatchCall == DISPATCH_CALL_DISPATCH_INDIRECT);

		assertValidShaderStage(m_stage);
	}